

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect GetBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  ImRect IVar3;
  ImRect IVar4;
  ImRect IVar5;
  ImRect IVar6;
  
  IVar5.Min.x = (window->Pos).x;
  fVar1 = (window->Size).x + IVar5.Min.x;
  IVar3.Min.y = (window->Pos).y;
  fVar2 = (window->Size).y + IVar3.Min.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar1 = fVar1 + -1.0;
    fVar2 = fVar2 + -1.0;
  }
  switch(border_n) {
  case 0:
    IVar3.Max.x = fVar1 - perp_padding;
    IVar3.Max.y = IVar3.Min.y + thickness;
    IVar3.Min.x = IVar5.Min.x + perp_padding;
    return IVar3;
  case 1:
    IVar6.Min.y = IVar3.Min.y + perp_padding;
    IVar6.Min.x = fVar1 - thickness;
    IVar6.Max.y = fVar2 - perp_padding;
    IVar6.Max.x = fVar1;
    return IVar6;
  case 2:
    IVar4.Min.x = IVar5.Min.x + perp_padding;
    IVar4.Min.y = fVar2 - thickness;
    IVar4.Max.x = fVar1 - perp_padding;
    IVar4.Max.y = fVar2;
    return IVar4;
  case 3:
    IVar5.Min.y = IVar3.Min.y + perp_padding;
    IVar5.Max.y = fVar2 - perp_padding;
    IVar5.Max.x = thickness + IVar5.Min.x;
    return IVar5;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1625,"ImRect GetBorderRect(ImGuiWindow *, int, float, float)");
  }
}

Assistant:

static ImRect GetBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y,                rect.Max.x - perp_padding, rect.Min.y + thickness);
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x,                rect.Max.y - perp_padding);
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y);
    if (border_n == 3) return ImRect(rect.Min.x,                rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);
    IM_ASSERT(0);
    return ImRect();
}